

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O1

string * returnUngapped(string *__return_storage_ptr__,string *input_sequence,
                       string *consensus_structure)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  char x;
  char y;
  int iVar3;
  pointer pcVar4;
  undefined8 uVar5;
  string *psVar6;
  bool bVar7;
  uint uVar8;
  void *pvVar9;
  void **ppvVar10;
  _Head_base<1UL,_int,_false> _Var11;
  ulong uVar12;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> lts;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> cb;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> sb;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> paren;
  tuple<char,_int> local_c8;
  ulong local_c0;
  void *local_b8;
  void *pvStack_b0;
  long local_a8;
  void *local_98;
  void *pvStack_90;
  long local_88;
  void *local_78;
  void *pvStack_70;
  long local_68;
  void *local_58;
  void *pvStack_50;
  long local_48;
  string *local_40;
  string *local_38;
  
  local_40 = input_sequence;
  local_38 = __return_storage_ptr__;
  local_c0 = consensus_structure->_M_string_length;
  local_48 = 0;
  local_58 = (void *)0x0;
  pvStack_50 = (void *)0x0;
  local_68 = 0;
  local_78 = (void *)0x0;
  pvStack_70 = (void *)0x0;
  local_88 = 0;
  local_98 = (void *)0x0;
  pvStack_90 = (void *)0x0;
  local_a8 = 0;
  local_b8 = (void *)0x0;
  pvStack_b0 = (void *)0x0;
  uVar8 = (uint)local_c0;
  if (0 < (int)uVar8) {
    uVar12 = 0;
    do {
      pcVar4 = (consensus_structure->_M_dataplus)._M_p;
      bVar2 = pcVar4[uVar12];
      _Var11._M_head_impl = (int)uVar12;
      if (bVar2 < 0x5b) {
        if (bVar2 < 0x3c) {
          if (bVar2 == 0x28) {
            local_c8.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>.
            _M_head_impl = pcVar4[uVar12];
            local_c8.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl =
                 (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var11._M_head_impl;
            std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
            emplace_back<std::tuple<char,int>>
                      ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)
                       &local_58,&local_c8);
          }
          else if (bVar2 == 0x29) {
            ppvVar10 = &pvStack_50;
            pvVar9 = pvStack_50;
            if (local_58 == pvStack_50) goto LAB_00117b03;
            goto LAB_00117b4b;
          }
        }
        else if (bVar2 == 0x3c) {
          local_c8.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl
               = pcVar4[uVar12];
          local_c8.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
          super__Head_base<1UL,_int,_false>._M_head_impl =
               (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var11._M_head_impl;
          std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
          emplace_back<std::tuple<char,int>>
                    ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&local_b8,
                     &local_c8);
        }
        else {
LAB_00117b03:
          if (bVar2 == 0x3e) {
            ppvVar10 = &pvStack_b0;
            pvVar9 = pvStack_b0;
            if (local_b8 == pvStack_b0) goto LAB_00117ade;
            goto LAB_00117b4b;
          }
        }
      }
      else if (bVar2 < 0x7b) {
        if (bVar2 == 0x5b) {
          local_c8.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl
               = pcVar4[uVar12];
          local_c8.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
          super__Head_base<1UL,_int,_false>._M_head_impl =
               (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var11._M_head_impl;
          std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
          emplace_back<std::tuple<char,int>>
                    ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&local_78,
                     &local_c8);
        }
        else {
LAB_00117ade:
          if (bVar2 == 0x5d) {
            ppvVar10 = &pvStack_70;
            pvVar9 = pvStack_70;
            if (local_78 != pvStack_70) goto LAB_00117b4b;
            goto LAB_00117b2d;
          }
        }
      }
      else if (bVar2 == 0x7b) {
        local_c8.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl =
             pcVar4[uVar12];
        local_c8.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var11._M_head_impl;
        std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
        emplace_back<std::tuple<char,int>>
                  ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&local_98,
                   &local_c8);
      }
      else {
LAB_00117b2d:
        if ((bVar2 == 0x7d) && (ppvVar10 = &pvStack_90, pvVar9 = pvStack_90, local_98 != pvStack_90)
           ) {
LAB_00117b4b:
          iVar3 = *(int *)((long)pvVar9 + -8);
          *ppvVar10 = (void *)((long)*ppvVar10 + -8);
          pcVar4 = (local_40->_M_dataplus)._M_p;
          x = pcVar4[uVar12];
          y = pcVar4[iVar3];
          bVar7 = canMatch(x,y);
          if ((!bVar7) &&
             ((x == '-' || ((consensus_structure->_M_dataplus)._M_p[uVar12] = '.', y != '-')))) {
            (consensus_structure->_M_dataplus)._M_p[iVar3] = '.';
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar12);
  }
  psVar6 = local_40;
  if ((((local_58 != pvStack_50) || (local_b8 != pvStack_b0)) || (local_78 != pvStack_70)) ||
     (local_98 != pvStack_90)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Error in reported structure. More left pairings than right pairings",0x43);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    exit(0);
  }
  uVar8 = (int)local_40->_M_string_length - 1;
  if (-1 < (int)uVar8) {
    uVar12 = (ulong)uVar8;
    do {
      if ((psVar6->_M_dataplus)._M_p[uVar12] == '-') {
        std::__cxx11::string::erase((ulong)consensus_structure,uVar12);
      }
      bVar7 = 0 < (long)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar7);
  }
  if (0 < (int)(uint)local_c0) {
    local_c0 = (ulong)((uint)local_c0 & 0x7fffffff);
    uVar12 = 0;
    do {
      pcVar4 = (consensus_structure->_M_dataplus)._M_p;
      bVar2 = pcVar4[uVar12];
      _Var11._M_head_impl = (int)uVar12;
      if (bVar2 < 0x5b) {
        if (bVar2 < 0x3c) {
          if (bVar2 == 0x28) {
            local_c8.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>.
            _M_head_impl = pcVar4[uVar12];
            local_c8.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl =
                 (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var11._M_head_impl;
            std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
            emplace_back<std::tuple<char,int>>
                      ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)
                       &local_58,&local_c8);
          }
          else if (bVar2 == 0x29) {
            pvVar9 = pvStack_50;
            ppvVar10 = &pvStack_50;
            if (local_58 == pvStack_50) goto LAB_00117d27;
            goto LAB_00117d6d;
          }
        }
        else if (bVar2 == 0x3c) {
          local_c8.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl
               = pcVar4[uVar12];
          local_c8.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
          super__Head_base<1UL,_int,_false>._M_head_impl =
               (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var11._M_head_impl;
          std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
          emplace_back<std::tuple<char,int>>
                    ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&local_b8,
                     &local_c8);
        }
        else {
LAB_00117d27:
          if (bVar2 == 0x3e) {
            ppvVar10 = &pvStack_b0;
            pvVar9 = pvStack_b0;
            if (local_b8 == pvStack_b0) goto LAB_00117d02;
            goto LAB_00117d6d;
          }
        }
      }
      else if (bVar2 < 0x7b) {
        if (bVar2 == 0x5b) {
          local_c8.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl
               = pcVar4[uVar12];
          local_c8.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
          super__Head_base<1UL,_int,_false>._M_head_impl =
               (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var11._M_head_impl;
          std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
          emplace_back<std::tuple<char,int>>
                    ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&local_78,
                     &local_c8);
        }
        else {
LAB_00117d02:
          if (bVar2 == 0x5d) {
            pvVar9 = pvStack_70;
            ppvVar10 = &pvStack_70;
            if (local_78 != pvStack_70) goto LAB_00117d6d;
            goto LAB_00117d51;
          }
        }
      }
      else if (bVar2 == 0x7b) {
        local_c8.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl =
             pcVar4[uVar12];
        local_c8.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var11._M_head_impl;
        std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
        emplace_back<std::tuple<char,int>>
                  ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&local_98,
                   &local_c8);
      }
      else {
LAB_00117d51:
        if ((bVar2 == 0x7d) && (pvVar9 = pvStack_90, ppvVar10 = &pvStack_90, local_98 != pvStack_90)
           ) {
LAB_00117d6d:
          iVar3 = *(int *)((long)pvVar9 + -8);
          *ppvVar10 = (void *)((long)*ppvVar10 + -8);
          if (_Var11._M_head_impl - iVar3 < 4) {
            (consensus_structure->_M_dataplus)._M_p[uVar12] = '.';
            (consensus_structure->_M_dataplus)._M_p[iVar3] = '.';
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while (local_c0 != uVar12);
  }
  psVar6 = local_38;
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  pcVar4 = (consensus_structure->_M_dataplus)._M_p;
  paVar1 = &consensus_structure->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar5 = *(undefined8 *)((long)&consensus_structure->field_2 + 8);
    (local_38->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_38->field_2 + 8) = uVar5;
  }
  else {
    (local_38->_M_dataplus)._M_p = pcVar4;
    (local_38->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38->_M_string_length = consensus_structure->_M_string_length;
  (consensus_structure->_M_dataplus)._M_p = (pointer)paVar1;
  consensus_structure->_M_string_length = 0;
  (consensus_structure->field_2)._M_local_buf[0] = '\0';
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8,local_a8 - (long)local_b8);
  }
  if (local_98 != (void *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  return psVar6;
}

Assistant:

std::string returnUngapped(std::string input_sequence, std::string consensus_structure){
    int length = consensus_structure.length();

    std::vector<std::tuple<char,int> > paren;
    std::vector<std::tuple<char,int> > sb;
    std::vector<std::tuple<char,int> > cb;
    std::vector<std::tuple<char,int> > lts;
    for(int i=0;i<length;i++){
        if(consensus_structure[i] == '(') {
            paren.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '<') {
            lts.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '[') {
            sb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '{') {
            cb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        std::tuple<char,int> x;
        bool close = false;
        if (consensus_structure[i] == ')' && !paren.empty()){
            x = paren[paren.size()-1];
            paren.erase(paren.begin()+(paren.size()-1));
            close = true;

        }
        else if (consensus_structure[i] == '>' && !lts.empty()){
            x = lts[lts.size()-1];
            lts.erase(lts.begin()+(lts.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == ']' && !sb.empty()){
            x = sb[sb.size()-1];
            sb.erase(sb.begin()+(sb.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == '}' && !cb.empty()){
            x = cb[cb.size()-1];
            cb.erase(cb.begin()+(cb.size()-1));
            close = true;
        }
            
        // Checks to see if the pair can match
        if(close){
            if(canMatch(input_sequence[i],input_sequence[std::get<1>(x)])){
                
                continue;
            }
            else{
                if(input_sequence[i] == '-'){
                    consensus_structure[std::get<1>(x)] = '.';
                    continue;
                }else if(input_sequence[std::get<1>(x)] == '-'){
                    consensus_structure[i] = '.';
                    continue;   
                }
                else{
                    consensus_structure[i] = '.';
                    consensus_structure[std::get<1>(x)] = '.';
                    continue;
                }
            }
        }    
    }
    // Reports if not all pairs were closed
    if(!paren.empty() || !lts.empty() || !sb.empty() || !cb.empty()){
        std::cout << "Error in reported structure. More left pairings than right pairings" << std::endl;
        exit(0); 
    }
    // Erase Gaps
    for(int i= input_sequence.length()-1; i>=0;--i){
        if(input_sequence[i] == '-') consensus_structure.erase(i,1);
    }

    // Checks for pairs less than 3 distance away
    for(int i=0;i<length;i++){
        if(consensus_structure[i] == '(') {
            paren.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '<') {
            lts.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '[') {
            sb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '{') {
            cb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        std::tuple<char,int> x;
        bool close = false;
        if (consensus_structure[i] == ')' && !paren.empty()){
            x = paren[paren.size()-1];
            paren.erase(paren.begin()+(paren.size()-1));
            close = true;

        }
        else if (consensus_structure[i] == '>' && !lts.empty()){
            x = lts[lts.size()-1];
            lts.erase(lts.begin()+(lts.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == ']' && !sb.empty()){
            x = sb[sb.size()-1];
            sb.erase(sb.begin()+(sb.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == '}' && !cb.empty()){
            x = cb[cb.size()-1];
            cb.erase(cb.begin()+(cb.size()-1));
            close = true;
        }
            
        if(close){
            if(i-std::get<1>(x) < 4){
                consensus_structure[i] = '.';
                consensus_structure[std::get<1>(x)] = '.';
                continue;  
            }
        }
    }

return consensus_structure;

}